

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O1

void __thiscall
CurrentGenerator::CurrentGenerator(CurrentGenerator *this,CurrentGenerator_param *param)

{
  double dVar1;
  uint uVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00114b68;
  this->param = param;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar4;
  uVar2 = std::chrono::_V2::system_clock::now();
  (this->generator)._M_x = (ulong)uVar2 % 0x7fffffff + (ulong)((ulong)uVar2 % 0x7fffffff == 0);
  dVar1 = param->noiseStd;
  (this->distribution)._M_param._M_mean = param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

CurrentGenerator::CurrentGenerator(CurrentGenerator_param* param) : param(param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(seed);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}